

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cStencilTexturingTests.cpp
# Opt level: O1

GLuint gl4cts::StencilTexturing::Utils::createAndCompileShader
                 (Context *context,GLenum type,GLchar *code)

{
  ostringstream *this;
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  GLint length;
  GLint status;
  string message;
  int local_1ec;
  char *local_1e8;
  long local_1e0;
  char local_1d8;
  undefined7 uStack_1d7;
  GLchar *local_1c8;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar4;
  
  local_1c8 = code;
  iVar1 = (*context->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  GVar2 = (**(code **)(lVar4 + 0x3f0))(type);
  local_1ec = 0;
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"CreateShader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0xcf);
  (**(code **)(lVar4 + 0x12b8))(GVar2,1,&local_1c8,0);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"ShaderSource",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0xd4);
  (**(code **)(lVar4 + 0x248))(GVar2);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"CompileShader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0xd8);
  (**(code **)(lVar4 + 0xa70))(GVar2,0x8b81,&local_1ec);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"GetShaderiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0xdc);
  if (local_1ec != 1) {
    local_1e0 = 0;
    local_1d8 = '\0';
    local_1e8 = &local_1d8;
    (**(code **)(lVar4 + 0xa70))(GVar2,0x8b84);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"GetShaderiv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                    ,0xe6);
    std::__cxx11::string::resize((ulong)&local_1e8,'\0');
    (**(code **)(lVar4 + 0xa58))(GVar2,0,0,local_1e8);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"GetShaderInfoLog",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                    ,0xed);
    local_1b0._0_8_ = context->m_testCtx->m_log;
    this = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"Shader (",8);
    local_1c0.m_getName = glu::getShaderTypeName;
    local_1c0.m_value = type;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,") compilation failed: ",0x16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,local_1e8,local_1e0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    std::ios_base::~ios_base(local_138);
    iVar1 = (*context->m_renderCtx->_vptr_RenderContext[3])();
    if (GVar2 != 0) {
      (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x470))(GVar2);
    }
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,CONCAT71(uStack_1d7,local_1d8) + 1);
    }
    GVar2 = 0;
  }
  return GVar2;
}

Assistant:

GLuint Utils::createAndCompileShader(deqp::Context& context, const GLenum type, const GLchar* code)
{
	const Functions& gl		= context.getRenderContext().getFunctions();
	GLuint			 id		= gl.createShader(type);
	GLint			 status = GL_FALSE;

	GLU_EXPECT_NO_ERROR(gl.getError(), "CreateShader");

	try
	{
		gl.shaderSource(id, 1 /* count */, &code, 0 /* lengths */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ShaderSource");

		/* Compile */
		gl.compileShader(id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "CompileShader");

		/* Get compilation status */
		gl.getShaderiv(id, GL_COMPILE_STATUS, &status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderiv");

		/* Log compilation error */
		if (GL_TRUE != status)
		{
			glw::GLint  length = 0;
			std::string message;

			/* Error log length */
			gl.getShaderiv(id, GL_INFO_LOG_LENGTH, &length);
			GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderiv");

			/* Prepare storage */
			message.resize(length, 0);

			/* Get error log */
			gl.getShaderInfoLog(id, length, 0, &message[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderInfoLog");

			context.getTestContext().getLog() << tcu::TestLog::Message << "Shader (" << glu::getShaderTypeStr(type)
											  << ") compilation failed: " << message << tcu::TestLog::EndMessage;

			deleteShader(context, id);
			id = 0;
		}
	}
	catch (std::exception& exc)
	{
		deleteShader(context, id);
		throw exc;
	}

	return id;
}